

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_environment.cpp
# Opt level: O2

void S_UnloadReverbDef(void)

{
  ReverbContainer *pRVar1;
  ReverbContainer *pRVar2;
  ReverbContainer *pRVar3;
  ReverbContainer *pRVar4;
  
  pRVar2 = (ReverbContainer *)0x0;
  pRVar1 = Environments;
  while (pRVar4 = pRVar1, pRVar3 = pRVar2, pRVar4 != (ReverbContainer *)0x0) {
    pRVar1 = pRVar4->Next;
    pRVar2 = pRVar4;
    if (pRVar4->Builtin == false) {
      if (pRVar3 != (ReverbContainer *)0x0) {
        pRVar3->Next = pRVar1;
      }
      if (pRVar4->Name != (char *)0x0) {
        operator_delete__(pRVar4->Name);
      }
      operator_delete(pRVar4,0x98);
      pRVar2 = pRVar3;
    }
  }
  Environments = &Off;
  return;
}

Assistant:

void S_UnloadReverbDef ()
{
	ReverbContainer *probe = Environments;
	ReverbContainer **pNext = NULL;

	while (probe != NULL)
	{
		ReverbContainer *next = probe->Next;
		if (!probe->Builtin)
		{
			if (pNext != NULL) *pNext = probe->Next;
			delete[] const_cast<char *>(probe->Name);
			delete probe;
		}
		else
		{
			pNext = &probe->Next;
		}
		probe = next;
	}
	Environments = &Off;
}